

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall SymbolTable::addGlobalSymbol(SymbolTable *this,SleighSymbol *a)

{
  SymbolScope *this_00;
  SleighSymbol *pSVar1;
  LowlevelError *this_01;
  SleighSymbol *a_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  a->id = (uintm)((ulong)((long)(this->symbollist).
                                super__Vector_base<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->symbollist).
                               super__Vector_base<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  a_local = a;
  std::vector<SleighSymbol_*,_std::allocator<SleighSymbol_*>_>::push_back
            (&this->symbollist,&a_local);
  this_00 = *(this->table).super__Vector_base<SymbolScope_*,_std::allocator<SymbolScope_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  a_local->scopeid = this_00->id;
  pSVar1 = SymbolScope::addSymbol(this_00,a_local);
  if (pSVar1 == a_local) {
    return;
  }
  this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&local_58,"Duplicate symbol name \'",&a_local->name);
  std::operator+(&local_38,&local_58,"\'");
  LowlevelError::LowlevelError(this_01,&local_38);
  __cxa_throw(this_01,&SleighError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void SymbolTable::addGlobalSymbol(SleighSymbol *a)

{
  a->id = symbollist.size();
  symbollist.push_back(a);
  SymbolScope *scope = getGlobalScope();
  a->scopeid = scope->getId();
  SleighSymbol *res = scope->addSymbol(a);
  if (res != a)
    throw SleighError("Duplicate symbol name '" + a->getName() + "'");
}